

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool __thiscall cppcms::xss::uri_parser::relative_ref(uri_parser *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  
  bVar1 = relative_part(this);
  if (bVar1) {
    pcVar4 = this->begin_;
    pcVar3 = this->end_;
    if (pcVar4 != pcVar3) {
      if (*pcVar4 == '?') {
        this->begin_ = pcVar4 + 1;
        bVar2 = query(this);
        if (bVar2) {
          pcVar4 = this->begin_;
        }
        pcVar3 = this->end_;
      }
      this->begin_ = pcVar4;
      if ((pcVar4 != pcVar3) && (*pcVar4 == '#')) {
        this->begin_ = pcVar4 + 1;
        bVar2 = query(this);
        if (bVar2) {
          pcVar4 = this->begin_;
        }
      }
    }
    this->begin_ = pcVar4;
  }
  return bVar1;
}

Assistant:

bool relative_ref()
		{
			if(!relative_part())
				return false;

			{
				save_point sp2(this);
				if(follows('?') && query())
					sp2.commit();
			}

			{
				save_point sp2(this);
				if(follows('#') && fragment())
					sp2.commit();
			}
			return true;
		}